

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O0

LabelOpnd * IR::LabelOpnd::New(LabelInstr *labelInstr,Func *func)

{
  JitArenaAllocator *pJVar1;
  LabelOpnd *this;
  TrackAllocData local_48;
  LabelOpnd *labelOpnd;
  Func *func_local;
  LabelInstr *labelInstr_local;
  
  pJVar1 = func->m_alloc;
  labelOpnd = (LabelOpnd *)func;
  func_local = (Func *)labelInstr;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_48,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.cpp"
             ,0xb8c);
  pJVar1 = (JitArenaAllocator *)
           Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                          pJVar1,&local_48);
  this = (LabelOpnd *)new<Memory::JitArenaAllocator>(0x18,pJVar1,0x4e98c0);
  memset(this,0,0x18);
  LabelOpnd(this);
  this->m_label = (LabelInstr *)func_local;
  (this->super_Opnd).m_type = TyUint64;
  *(byte *)&func_local->propertiesWrittenTo = *(byte *)&func_local->propertiesWrittenTo & 0xfb | 4;
  (this->super_Opnd).m_kind = OpndKindLabel;
  return this;
}

Assistant:

LabelOpnd *
LabelOpnd::New(LabelInstr * labelInstr, Func * func)
{
    LabelOpnd * labelOpnd = JitAnew(func->m_alloc, IR::LabelOpnd);

    labelOpnd->m_label = labelInstr;
    labelOpnd->m_type = TyMachPtr;

    labelInstr->m_hasNonBranchRef = true;


    labelOpnd->m_kind = OpndKindLabel;

    return labelOpnd;
}